

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O1

ON_SubDSectorId ON_SubDSectorId::Create(ON_SubDVertex *vertex,ON_SubDFace *face)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ON_SubDSectorId *pOVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  ON_SubDEdge *pOVar7;
  ON_SubDFace *pOVar8;
  ON_SubDVertex *pOVar9;
  long lVar10;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar11;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ON_SubDSectorIterator *pOVar12;
  ulong uVar13;
  int iVar14;
  ON_SubDSectorIterator *pOVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  byte bVar21;
  ON_SubDSectorId OVar22;
  ON_SubDComponentPtrPair pair;
  ON_SubDSectorIterator sit1;
  ON_SubDSectorId local_f8;
  uint local_ec;
  ulong local_e8;
  int local_dc;
  ON_SubDComponentPtrPair local_d8;
  ON_SubDSectorIterator local_c8;
  ON_SubDSectorIterator local_78;
  
  bVar21 = 0;
  pOVar6 = &local_f8;
  local_f8.m_vertex_id = 0;
  local_f8.m_minimum_face_id = 0;
  if (vertex != (ON_SubDVertex *)0x0 && face == (ON_SubDFace *)0x0) {
    bVar4 = ON_SubDVertex::IsSingleSectorVertex(vertex);
    if (bVar4) {
      face = ON_SubDVertex::Face(vertex,0);
    }
    else {
      face = (ON_SubDFace *)0x0;
    }
  }
  if (vertex == (ON_SubDVertex *)0x0 || face == (ON_SubDFace *)0x0) {
    pOVar8 = (ON_SubDFace *)0x0;
    uVar5 = 0xffffffff;
    goto LAB_0062296a;
  }
  uVar5 = 0;
  uVar20 = 0;
  if ((((1 < (vertex->super_ON_SubDComponentBase).m_id + 1) &&
       (uVar20 = uVar5, 1 < (face->super_ON_SubDComponentBase).m_id + 1)) &&
      (2 < face->m_edge_count)) && ((1 < vertex->m_edge_count && (vertex->m_face_count != 0)))) {
    uVar5 = ON_SubDFace::VertexIndex(face,vertex);
    pOVar8 = (ON_SubDFace *)(ulong)face->m_edge_count;
    if (uVar5 < face->m_edge_count) {
      local_f8.m_minimum_face_id = (face->super_ON_SubDComponentBase).m_id;
      local_f8.m_vertex_id = (vertex->super_ON_SubDComponentBase).m_id;
      uVar1 = vertex->m_face_count;
      bVar4 = ON_SubDVertex::IsSmoothOrDart(vertex);
      pOVar8 = (ON_SubDFace *)CONCAT71(extraout_var,bVar4);
      if (bVar4) {
        uVar20 = 0;
        iVar16 = 2;
        uVar5 = extraout_EDX_00;
        if ((1 < uVar1) && (uVar1 == vertex->m_edge_count)) {
          bVar4 = ON_SubDVertex::IsDart(vertex);
          pOVar8 = (ON_SubDFace *)CONCAT71(extraout_var_00,bVar4);
          local_e8 = (ulong)bVar4;
          local_dc = (uint)bVar4 + (uint)bVar4;
          uVar20 = 0;
          uVar11 = extraout_RDX;
LAB_00622c61:
          uVar5 = (uint)uVar11;
          iVar16 = 2;
          if (uVar20 == 0) {
            iVar16 = 10;
            uVar3 = (uint)local_e8;
            uVar18 = local_f8.m_minimum_face_id;
            if ((ulong)vertex->m_edge_count == 0) {
              local_ec = 0;
            }
            else {
              uVar17 = 0;
              local_ec = 0;
              do {
                iVar16 = 1;
                uVar13 = vertex->m_edges[uVar17].m_ptr & 0xfffffffffffffff8;
                if (((uVar13 == 0) || (sVar2 = *(short *)(uVar13 + 100), sVar2 == 0)) ||
                   (uVar19 = *(ulong *)(uVar13 + 0x68) & 0xfffffffffffffff8, uVar19 == 0)) {
LAB_00622d2d:
                  uVar11 = (ulong)Invalid.m_sector_face_count;
                  pOVar8 = (ON_SubDFace *)Invalid._0_8_;
                }
                else {
                  uVar5 = *(uint *)(uVar19 + 8);
                  if (uVar5 < uVar18) {
                    uVar18 = uVar5;
                  }
                  if (*(char *)(uVar13 + 0x60) == '\x02') {
                    local_ec = local_ec + 1;
                    if ((uVar3 < local_ec) || (sVar2 != (short)local_dc)) goto LAB_00622d2d;
                    if (local_dc != 1) goto LAB_00622d0f;
                    iVar16 = 0xc;
                  }
                  else {
LAB_00622d0f:
                    if ((sVar2 != 2) ||
                       (uVar13 = *(ulong *)(uVar13 + 0x70) & 0xfffffffffffffff8, uVar13 == 0))
                    goto LAB_00622d2d;
                    uVar5 = *(uint *)(uVar13 + 8);
                    if (uVar5 < uVar18) {
                      uVar18 = uVar5;
                    }
                    iVar16 = 0;
                  }
                }
                uVar5 = (uint)uVar11;
                if ((iVar16 != 0xc) && (iVar16 != 0)) goto LAB_00622d68;
                uVar17 = uVar17 + 1;
              } while (vertex->m_edge_count != uVar17);
              iVar16 = 10;
            }
LAB_00622d68:
            local_f8.m_minimum_face_id = uVar18;
            uVar18 = (uint)uVar1;
            if (local_ec != uVar3) {
              uVar18 = uVar20;
            }
            if (iVar16 == 10) {
              uVar20 = uVar18;
            }
            iVar14 = 0;
            if (iVar16 != 10) {
              iVar14 = iVar16;
            }
            iVar16 = 2;
            if (iVar14 != 0) {
              iVar16 = iVar14;
            }
          }
        }
      }
      else {
        bVar4 = ON_SubDVertex::IsCreaseOrCorner(vertex);
        pOVar8 = (ON_SubDFace *)CONCAT71(extraout_var_01,bVar4);
        if (bVar4) {
          if ((uVar1 + 1 == (uint)vertex->m_edge_count) &&
             (uVar20 = ON_SubDVertex::CreasedEdgeCount(vertex,true,true,true,false), uVar20 == 2)) {
            local_d8 = ON_SubDVertex::BoundaryEdgePair(vertex);
          }
          else {
            local_d8.m_pair[1].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
            local_d8.m_pair[0].m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
          }
          bVar4 = ON_SubDComponentPtrPair::BothAreNotNull(&local_d8);
          if (bVar4) {
            local_c8.m_center_vertex = (ON_SubDVertex *)ON_SubDComponentPtrPair::First(&local_d8);
            pOVar7 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&local_c8);
            local_78.m_center_vertex = (ON_SubDVertex *)ON_SubDComponentPtrPair::Second(&local_d8);
            pOVar8 = (ON_SubDFace *)ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&local_78);
            bVar4 = pOVar8 == (ON_SubDFace *)0x0 || pOVar7 == (ON_SubDEdge *)0x0;
            uVar11 = CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),bVar4);
            iVar16 = 2;
            if (((bVar4) || (pOVar7->m_face_count != 1)) || ((unsigned_short)pOVar8->m_pack_id != 1)
               ) {
              local_e8 = 0;
              local_dc = 0;
            }
            else {
              local_dc = 1;
              local_e8 = 2;
              iVar16 = 0;
            }
            uVar20 = 0;
          }
          else {
            bVar4 = ON_SubDVertex::IsCrease(vertex);
            if ((bVar4) && (uVar1 != vertex->m_edge_count)) {
              uVar11 = (ulong)Invalid.m_sector_face_count;
              iVar16 = 1;
              uVar20 = 0;
              pOVar8 = (ON_SubDFace *)Invalid._0_8_;
            }
            else {
              local_c8.m_current_fei[0] = 0;
              local_c8.m_current_fei[1] = 0;
              local_c8.m_initial_face_dir = 0;
              local_c8.m_current_face_dir = 0;
              local_c8.m_current_eptr[1].m_ptr = 0;
              local_c8.m_initial_fvi = 0;
              local_c8.m_current_fvi = 0;
              local_c8.m_current_face = (ON_SubDFace *)0x0;
              local_c8.m_current_eptr[0].m_ptr = 0;
              local_c8.m_center_vertex = (ON_SubDVertex *)0x0;
              local_c8.m_initial_face = (ON_SubDFace *)0x0;
              local_c8.m_current_ring_index = 0;
              uVar20 = 0;
              pOVar9 = ON_SubDSectorIterator::Initialize(&local_c8,face,0,uVar5);
              if (pOVar9 == vertex) {
                pOVar12 = &local_c8;
                pOVar15 = &local_78;
                for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
                  pOVar15->m_center_vertex = pOVar12->m_center_vertex;
                  pOVar12 = (ON_SubDSectorIterator *)((long)pOVar12 + (ulong)bVar21 * -0x10 + 8);
                  pOVar15 = (ON_SubDSectorIterator *)((long)pOVar15 + ((ulong)bVar21 * -2 + 1) * 8);
                }
                uVar20 = 1;
                pOVar8 = ON_SubDSectorIterator::IncrementFace(&local_c8,1,AnyCrease);
                uVar5 = local_f8.m_minimum_face_id;
                if (pOVar8 != (ON_SubDFace *)0x0) {
                  uVar20 = 1;
                  do {
                    if (vertex->m_face_count < uVar20) break;
                    uVar20 = uVar20 + 1;
                    uVar3 = (pOVar8->super_ON_SubDComponentBase).m_id;
                    if (uVar3 < uVar5) {
                      uVar5 = uVar3;
                    }
                    pOVar8 = ON_SubDSectorIterator::IncrementFace(&local_c8,1,AnyCrease);
                  } while (pOVar8 != (ON_SubDFace *)0x0);
                }
                local_f8.m_minimum_face_id = uVar5;
                pOVar8 = ON_SubDSectorIterator::IncrementFace(&local_78,-1,AnyCrease);
                uVar11 = extraout_RDX_01;
                if (pOVar8 != (ON_SubDFace *)0x0) {
                  do {
                    if (vertex->m_face_count < uVar20) break;
                    uVar20 = uVar20 + 1;
                    uVar3 = (pOVar8->super_ON_SubDComponentBase).m_id;
                    if (uVar3 < uVar5) {
                      uVar5 = uVar3;
                    }
                    pOVar8 = ON_SubDSectorIterator::IncrementFace(&local_78,-1,AnyCrease);
                    uVar11 = extraout_RDX_02;
                  } while (pOVar8 != (ON_SubDFace *)0x0);
                }
                local_f8.m_minimum_face_id = uVar5;
                iVar16 = 2;
              }
              else {
                uVar11 = (ulong)Invalid.m_sector_face_count;
                iVar16 = 1;
                pOVar8 = (ON_SubDFace *)Invalid._0_8_;
              }
            }
            local_e8 = 0;
            local_dc = 0;
          }
          uVar5 = (uint)uVar11;
          if (iVar16 == 0) goto LAB_00622c61;
        }
        else {
          uVar20 = 0;
          iVar16 = 2;
          uVar5 = extraout_EDX_01;
        }
      }
      bVar4 = iVar16 == 2;
    }
    else {
      bVar4 = true;
      uVar20 = 0;
      uVar5 = extraout_EDX;
    }
    if (!bVar4) goto LAB_0062296a;
  }
  if ((((local_f8.m_vertex_id == 0) || (local_f8.m_minimum_face_id == 0)) ||
      ((0xffff < uVar20 || local_f8.m_minimum_face_id == 0xffffffff) ||
       (local_f8.m_vertex_id == 0xffffffff || uVar20 == 0))) || (vertex->m_face_count < uVar20)) {
    pOVar6 = &Invalid;
    uVar20 = Invalid.m_sector_face_count;
  }
  pOVar8 = *(ON_SubDFace **)pOVar6;
  uVar5 = uVar20;
LAB_0062296a:
  OVar22.m_sector_face_count = uVar5;
  OVar22._0_8_ = pOVar8;
  return OVar22;
}

Assistant:

const ON_SubDSectorId ON_SubDSectorId::Create(
  const ON_SubDVertex* vertex,
  const ON_SubDFace* face
)
{
  ON_SubDSectorId sid;

  if (nullptr == face && nullptr != vertex && vertex->IsSingleSectorVertex())
    face = vertex->Face(0);

  if (nullptr == vertex || nullptr == face)
  {
    // Creation of ON_SubDSectorId::Invalid in opennurbs_statics.cpp or 
    // just another invalid input.
    sid.m_vertex_id = 0;
    sid.m_minimum_face_id = 0;
    sid.m_sector_face_count = 0xFFFFFFFFU;
    return sid;
  }

  for (;;)
  {
    if (vertex->m_id <= 0 || vertex->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_id <= 0 || face->m_id >= ON_UNSET_UINT_INDEX)
      break;
    if (face->m_edge_count < 3)
      break;
    if (vertex->m_edge_count < 2)
      break;
    if (vertex->m_face_count < 1)
      break;
    const unsigned face_vi = face->VertexIndex(vertex);
    if (face_vi >= face->m_edge_count)
      break;

    sid.m_vertex_id = vertex->m_id;
    sid.m_minimum_face_id = face->m_id;
    const unsigned short n = vertex->m_face_count;
    unsigned short crease_face_count = 0;
    unsigned int expected_crease_count = 0;
    if (vertex->IsSmoothOrDart())
    {
      if (n < 2 || n != vertex->m_edge_count)
        break;
      const bool bIsDart = vertex->IsDart();
      crease_face_count = bIsDart ? 2 : 0;
      expected_crease_count = bIsDart ? 1 : 0;
    }
    else if ( vertex->IsCreaseOrCorner())
    {
      const ON_SubDComponentPtrPair pair 
        = (n + 1 == vertex->m_edge_count && 2==vertex->CreasedEdgeCount(true,true,true,false))
          ? vertex->BoundaryEdgePair()
          : ON_SubDComponentPtrPair::Null;
      if (pair.BothAreNotNull())
      {
        // we can avoid using a sector iterator
        const ON_SubDEdge* e[2] = { pair.First().Edge(),pair.Second().Edge() };
        if (nullptr == e[0] || nullptr == e[1])
          break;
        if (1 != e[0]->m_face_count || 1 != e[1]->m_face_count)
          break;
        crease_face_count = 1;
        expected_crease_count = 2;
      }
      else
      {
        if (vertex->IsCrease())
        {
          if (n != vertex->m_edge_count)
            return ON_SubDSectorId::Invalid;
        }

        // complicated case needs to use more time consuming sector iterator 
        ON_SubDSectorIterator sit0;
        if ( vertex != sit0.Initialize(face, 0, face_vi))
          return ON_SubDSectorId::Invalid;
        ON_SubDSectorIterator sit1(sit0);
        // advance sit0 until we hit a crease;
        sid.m_sector_face_count = 1;
        for (const ON_SubDFace* f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit0.NextFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        // advance sit1 until we hit a crease;
        for (const ON_SubDFace* f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease); nullptr != f && sid.m_sector_face_count <= vertex->m_face_count; f = sit1.PrevFace(ON_SubDSectorIterator::StopAt::AnyCrease))
        {
          ++sid.m_sector_face_count;
          if (f->m_id < sid.m_minimum_face_id)
            sid.m_minimum_face_id = f->m_id;
        }
        break;
      }
    }
    else
    {
      break;
    }

    if (0 == sid.m_sector_face_count)
    {
      // we can avoid expensive sector iterator.
      unsigned int crease_count = 0;
      const ON_SubDFace* f;
      for (unsigned short vei = 0; vei < vertex->m_edge_count; ++vei)
      {
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
        if (nullptr == e || 0 == e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[0].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
        if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
        {
          ++crease_count;
          if (crease_count > expected_crease_count)
            return ON_SubDSectorId::Invalid;
          if (crease_face_count != e->m_face_count)
            return ON_SubDSectorId::Invalid;
          if (1 == crease_face_count)
            continue;
        }
        if (2 != e->m_face_count)
          return ON_SubDSectorId::Invalid;
        f = ON_SUBD_FACE_POINTER(e->m_face2[1].m_ptr);
        if (nullptr == f)
          return ON_SubDSectorId::Invalid;
        if (f->m_id < sid.m_minimum_face_id)
          sid.m_minimum_face_id = f->m_id;
      }
      if (crease_count == expected_crease_count)
        sid.m_sector_face_count = n;
    }
    break;
  }

  return (sid.IsSet() && sid.m_sector_face_count <= vertex->m_face_count) ? sid : ON_SubDSectorId::Invalid;
}